

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TStokesAnalytic::Force(TStokesAnalytic *this,TPZVec<double> *x,TPZVec<double> *force)

{
  double dVar1;
  double *pdVar2;
  TPZVec<double> *in_RDX;
  TPZVec<double> *in_RSI;
  long in_RDI;
  double dVar3;
  double dVar4;
  int f_2;
  int e_2;
  int f_1;
  int e_1;
  int f;
  int e;
  int i;
  TPZFMatrix<double> grad;
  TPZManVector<double,_3> xst;
  TPZManVector<double,_3> gradUt_beta;
  TPZManVector<double,_3> gradU_beta;
  TPZManVector<double,_3> beta;
  TPZManVector<double,_3> locforce;
  TPZManVector<double,_3> *in_stack_fffffffffffffb10;
  int64_t in_stack_fffffffffffffb20;
  int64_t in_stack_fffffffffffffb28;
  TPZFMatrix<double> *in_stack_fffffffffffffb30;
  int64_t in_stack_fffffffffffffb38;
  TPZManVector<double,_3> *in_stack_fffffffffffffb40;
  double *in_stack_fffffffffffffb58;
  int64_t in_stack_fffffffffffffb60;
  int64_t in_stack_fffffffffffffb68;
  TPZFMatrix<double> *in_stack_fffffffffffffb70;
  TPZFMatrix<double> *in_stack_fffffffffffffc70;
  TPZVec<double> *in_stack_fffffffffffffc78;
  TStokesAnalytic *in_stack_fffffffffffffc80;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  undefined4 in_stack_fffffffffffffe00;
  int iVar5;
  TPZVec<double> *x_00;
  TStokesAnalytic *in_stack_fffffffffffffe10;
  TPZVec<double> *in_stack_fffffffffffffe20;
  TPZVec<double> *in_stack_fffffffffffffe28;
  TStokesAnalytic *in_stack_fffffffffffffe30;
  TPZVec<double> local_160;
  undefined8 local_128;
  TPZVec<double> local_120;
  undefined8 local_e8;
  double *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  TPZVec<double> local_90;
  undefined8 local_58;
  TPZVec<double> local_50;
  TPZVec<double> *local_18;
  TPZVec<double> *local_10;
  
  local_58 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,(double *)in_stack_fffffffffffffb30
            );
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,(double *)in_stack_fffffffffffffb30
            );
  local_e8 = 0;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,(double *)in_stack_fffffffffffffb30
            );
  local_128 = 0;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,(double *)in_stack_fffffffffffffb30
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  x_00 = (TPZVec<double> *)0x0;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58);
  for (iVar5 = 0; iVar5 < 3; iVar5 = iVar5 + 1) {
    pdVar2 = TPZVec<double>::operator[](local_10,(long)iVar5);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_160,(long)iVar5);
    *pdVar2 = dVar4;
  }
  DivSigma<double>(in_stack_fffffffffffffe10,x_00,
                   (TPZVec<double> *)CONCAT44(iVar5,in_stack_fffffffffffffe00));
  switch(*(undefined4 *)(in_RDI + 0x10)) {
  case 0:
    pdVar2 = TPZVec<double>::operator[](&local_50,0);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,0);
    *pdVar2 = -dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,1);
    *pdVar2 = -dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,2);
    *pdVar2 = -dVar4;
    break;
  case 1:
  case 2:
    graduxy<double>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    uxy<double>(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    for (iVar5 = 0; iVar5 < 3; iVar5 = iVar5 + 1) {
      for (local_204 = 0; local_204 < 3; local_204 = local_204 + 1) {
        pdVar2 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                            in_stack_fffffffffffffb20);
        dVar4 = *pdVar2;
        pdVar2 = TPZVec<double>::operator[](&local_90,(long)local_204);
        dVar3 = *pdVar2;
        pdVar2 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff20,(long)iVar5);
        *pdVar2 = dVar4 * dVar3 + *pdVar2;
      }
    }
    pdVar2 = TPZVec<double>::operator[](&local_50,0);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff20,0);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,0);
    *pdVar2 = -dVar4 + dVar3;
    pdVar2 = TPZVec<double>::operator[](&local_50,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff20,1);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,1);
    *pdVar2 = -dVar4 + dVar3;
    pdVar2 = TPZVec<double>::operator[](&local_50,2);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff20,2);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,2);
    *pdVar2 = -dVar4 + dVar3;
    break;
  case 3:
  case 4:
    graduxy<double>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    uxy<double>(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    for (local_208 = 0; local_208 < 3; local_208 = local_208 + 1) {
      for (local_20c = 0; local_20c < 3; local_20c = local_20c + 1) {
        pdVar2 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                            in_stack_fffffffffffffb20);
        dVar4 = *pdVar2;
        pdVar2 = TPZVec<double>::operator[](&local_90,(long)local_20c);
        dVar3 = *pdVar2;
        pdVar2 = TPZVec<double>::operator[]
                           ((TPZVec<double> *)&stack0xffffffffffffff20,(long)local_208);
        *pdVar2 = dVar4 * dVar3 + *pdVar2;
      }
    }
    for (local_210 = 0; local_210 < 3; local_210 = local_210 + 1) {
      for (local_214 = 0; local_214 < 3; local_214 = local_214 + 1) {
        pdVar2 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                            in_stack_fffffffffffffb20);
        dVar4 = *pdVar2;
        pdVar2 = TPZVec<double>::operator[](&local_90,(long)local_214);
        dVar3 = *pdVar2;
        pdVar2 = TPZVec<double>::operator[](&local_120,(long)local_210);
        *pdVar2 = dVar4 * dVar3 + *pdVar2;
      }
    }
    pdVar2 = TPZVec<double>::operator[](&local_50,0);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff20,0);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_120,0);
    dVar1 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,0);
    *pdVar2 = (-dVar4 + dVar3) - dVar1;
    pdVar2 = TPZVec<double>::operator[](&local_50,1);
    dVar3 = -*pdVar2;
    pdVar2 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff20,1);
    dVar3 = dVar3 + *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_120,1);
    dVar4 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,1);
    *pdVar2 = dVar3 - dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,2);
    dVar4 = -*pdVar2;
    pdVar2 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff20,2);
    dVar4 = dVar4 + *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_120,2);
    in_stack_fffffffffffffb10 = (TPZManVector<double,_3> *)(dVar4 - *pdVar2);
    pdVar2 = TPZVec<double>::operator[](local_18,2);
    *pdVar2 = (double)in_stack_fffffffffffffb10;
    break;
  case 5:
    uxy<double>(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    pdVar2 = TPZVec<double>::operator[](&local_50,0);
    dVar4 = *pdVar2;
    dVar3 = *(double *)(in_RDI + 0x30);
    pdVar2 = TPZVec<double>::operator[](&local_90,0);
    dVar1 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,0);
    *pdVar2 = dVar3 * dVar1 + -dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,1);
    dVar4 = *pdVar2;
    dVar3 = *(double *)(in_RDI + 0x30);
    pdVar2 = TPZVec<double>::operator[](&local_90,1);
    dVar1 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,1);
    *pdVar2 = dVar3 * dVar1 + -dVar4;
    pdVar2 = TPZVec<double>::operator[](&local_50,2);
    dVar4 = *pdVar2;
    dVar3 = *(double *)(in_RDI + 0x30);
    pdVar2 = TPZVec<double>::operator[](&local_90,2);
    dVar1 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,2);
    *pdVar2 = dVar3 * dVar1 + -dVar4;
    graduxy<double>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                        in_stack_fffffffffffffb20);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                        in_stack_fffffffffffffb20);
    dVar3 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                        in_stack_fffffffffffffb20);
    dVar1 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_18,3);
    *pdVar2 = dVar4 + dVar3 + dVar1;
    break;
  default:
    pzinternal::DebugStopImpl(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
  }
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1e6cf2a);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb10);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb10);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb10);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb10);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb10);
  return;
}

Assistant:

void TStokesAnalytic::Force(const TPZVec<REAL> &x, TPZVec<STATE> &force) const
{

    TPZManVector<STATE,3> locforce(3,0.),beta(3,0.),gradU_beta(3,0.),gradUt_beta(3,0.),xst(3);
    TPZFMatrix<STATE> grad(3,3,0.);
    for(int i=0; i<3; i++) xst[i] = x[i];
    DivSigma(x, locforce);

    switch(fProblemType)
    {
        case EStokes:
            force[0] = -locforce[0];
            force[1] = -locforce[1];
            force[2] = -locforce[2];
            break;

        case EBrinkman:
    	    uxy(xst,beta);
            force[0] = -locforce[0]+fcBrinkman*beta[0];
            force[1] = -locforce[1]+fcBrinkman*beta[1];
            force[2] = -locforce[2]+fcBrinkman*beta[2];
	    graduxy(xst,grad);
            force[3] = grad(0,0)+grad(1,1)+grad(2,2); //Pressure block term
            break;
            
        case ENavierStokes:
        case EOseen:

            graduxy(xst,grad);
            uxy(xst,beta);
            
            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradU_beta[e] += grad(e,f)*beta[f];
                }
            }
            
            force[0] = -locforce[0]+gradU_beta[0];
            force[1] = -locforce[1]+gradU_beta[1];
            force[2] = -locforce[2]+gradU_beta[2];
            break;

        case ENavierStokesCDG:
        case EOseenCDG:

            graduxy(xst,grad);
            uxy(xst,beta);

            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradU_beta[e] += grad(e,f)*beta[f];
                }
            }

            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradUt_beta[e] += grad(f,e)*beta[f];
                }
            }

            force[0] = -locforce[0]+gradU_beta[0]-gradUt_beta[0];
            force[1] = -locforce[1]+gradU_beta[1]-gradUt_beta[1];
            force[2] = -locforce[2]+gradU_beta[2]-gradUt_beta[2];
            break;
            
        default:
            DebugStop();
    }



}